

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

unrecognized_param * __thiscall
boost::runtime::specific_param_error<boost::runtime::unrecognized_param,boost::runtime::input_error>
::operator<<(unrecognized_param *__return_storage_ptr__,
            specific_param_error<boost::runtime::unrecognized_param,boost::runtime::input_error>
            *this,basic_cstring<const_char> *val)

{
  string local_40;
  
  unit_test::utils::string_cast<boost::unit_test::basic_cstring<char_const>>
            (&local_40,(utils *)val,val);
  std::__cxx11::string::append((string *)(this + 0x18));
  std::__cxx11::string::~string((string *)&local_40);
  unrecognized_param::unrecognized_param(__return_storage_ptr__,(unrecognized_param *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(T const& val) &&
    {
        this->msg.append( unit_test::utils::string_cast( val ) );

        return reinterpret_cast<Derived&&>(*this);
    }